

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::cmInstallTargetGenerator
          (cmInstallTargetGenerator *this,string *targetName,string *dest,bool implib,
          string *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,bool optional
          ,cmListFileBacktrace *backtrace)

{
  byte bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_00;
  cmListFileBacktrace local_a0 [2];
  string local_80;
  string local_60;
  byte local_3a;
  byte local_39;
  bool optional_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_38;
  bool exclude_from_all_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  string *file_permissions_local;
  string *psStack_20;
  bool implib_local;
  string *dest_local;
  string *targetName_local;
  cmInstallTargetGenerator *this_local;
  
  local_39 = exclude_from_all;
  local_3a = optional;
  pvStack_38 = configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)file_permissions;
  file_permissions_local._7_1_ = implib;
  psStack_20 = dest;
  dest_local = targetName;
  targetName_local = (string *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)dest);
  configurations_00 = pvStack_38;
  std::__cxx11::string::string((string *)&local_80,(string *)component);
  bVar1 = local_39;
  cmListFileBacktrace::cmListFileBacktrace(local_a0,backtrace);
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_60,configurations_00,&local_80,message,
             (bool)(bVar1 & 1),false,local_a0);
  cmListFileBacktrace::~cmListFileBacktrace(local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallTargetGenerator_01559ad0;
  std::__cxx11::string::string((string *)&this->TargetName,(string *)targetName);
  this->Target = (cmGeneratorTarget *)0x0;
  std::__cxx11::string::string((string *)&this->FilePermissions,(string *)file_permissions);
  this->ImportLibrary = (bool)(file_permissions_local._7_1_ & 1);
  this->Optional = (bool)(local_3a & 1);
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  this->NamelinkMode = NamelinkModeNone;
  this->ImportlinkMode = NamelinkModeNone;
  return;
}

Assistant:

cmInstallTargetGenerator::cmInstallTargetGenerator(
  std::string targetName, std::string const& dest, bool implib,
  std::string file_permissions, std::vector<std::string> const& configurations,
  std::string const& component, MessageLevel message, bool exclude_from_all,
  bool optional, cmListFileBacktrace backtrace)
  : cmInstallGenerator(dest, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , TargetName(std::move(targetName))
  , FilePermissions(std::move(file_permissions))
  , ImportLibrary(implib)
  , Optional(optional)
{
  this->ActionsPerConfig = true;
  this->NamelinkMode = NamelinkModeNone;
  this->ImportlinkMode = NamelinkModeNone;
}